

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O1

SuffixTreeNode * __thiscall
wasm::SuffixTree::insertLeaf
          (SuffixTree *this,SuffixTreeInternalNode *Parent,uint StartIdx,uint Edge)

{
  mapped_type pSVar1;
  mapped_type *ppSVar2;
  uint local_2c [2];
  uint Edge_local;
  
  local_2c[0] = Edge;
  if (StartIdx <= this->LeafEndIdx) {
    pSVar1 = (mapped_type)
             llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                       (&(this->LeafNodeAllocator).Allocator,0x20,(Align)0x3);
    pSVar1->Kind = ST_Leaf;
    pSVar1->StartIdx = StartIdx;
    *(undefined8 *)&pSVar1->ConcatLen = 0xffffffff00000000;
    pSVar1->_vptr_SuffixTreeNode = (_func_int **)&PTR_getEndIdx_01097678;
    pSVar1[1]._vptr_SuffixTreeNode = (_func_int **)&this->LeafEndIdx;
    ppSVar2 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&Parent->Children,local_2c);
    *ppSVar2 = pSVar1;
    return pSVar1;
  }
  __assert_fail("StartIdx <= LeafEndIdx && \"String can\'t start after it ends!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                ,0x3c,
                "SuffixTreeNode *wasm::SuffixTree::insertLeaf(SuffixTreeInternalNode &, unsigned int, unsigned int)"
               );
}

Assistant:

SuffixTreeNode* SuffixTree::insertLeaf(SuffixTreeInternalNode& Parent,
                                       unsigned StartIdx,
                                       unsigned Edge) {
  assert(StartIdx <= LeafEndIdx && "String can't start after it ends!");
  auto* N = new (LeafNodeAllocator.Allocate())
    SuffixTreeLeafNode(StartIdx, &LeafEndIdx);
  Parent.Children[Edge] = N;
  return N;
}